

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O1

string * __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::trace_error_abi_cxx11_
          (string *__return_storage_ptr__,BinBinaryReader *this)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint __len;
  pointer ppVar5;
  ulong __val;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ppVar5 = (this->error).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar5 == (this->error).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      return __return_storage_ptr__;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,ppVar5[-1].first._M_dataplus._M_p,
               ppVar5[-1].first._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__," @ ");
    uVar4 = (long)(this->reader).beg_ - (long)ppVar5[-1].second;
    __val = -uVar4;
    if (0 < (long)uVar4) {
      __val = uVar4;
    }
    __len = 1;
    if (9 < __val) {
      uVar3 = __val;
      uVar2 = 4;
      do {
        __len = uVar2;
        if (uVar3 < 100) {
          __len = __len - 2;
          goto LAB_00113718;
        }
        if (uVar3 < 1000) {
          __len = __len - 1;
          goto LAB_00113718;
        }
        if (uVar3 < 10000) goto LAB_00113718;
        bVar1 = 99999 < uVar3;
        uVar3 = uVar3 / 10000;
        uVar2 = __len + 4;
      } while (bVar1);
      __len = __len + 1;
    }
LAB_00113718:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_50,(ulong)(__len - (int)((long)uVar4 >> 0x3f)),'-');
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_50._M_dataplus._M_p + -((long)uVar4 >> 0x3f),__len,__val);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    ppVar5 = ppVar5 + -1;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\n");
  } while( true );
}

Assistant:

std::string trace_error() noexcept {
            std::string trace;
            for(auto e = error.crbegin(); e != error.crend(); e++) {
                trace.append(e->first);
                trace.append(" @ ");
                trace.append(std::to_string(reader.beg_ - e->second));
                trace.append("\n");
            }
            return trace;
        }